

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_parse_invalid_value(void)

{
  int iVar1;
  char *local_58;
  char *args [5];
  int j;
  int i;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init((cargo_t *)&j,0,"program");
  if (iVar1 == 0) {
    memcpy(&local_58,&DAT_0013e190,0x28);
    cargo._4_4_ = cargo_add_option(_j,0,"--alpha -a","The alpha","i",(long)args + 0x24);
    cargo._4_4_ = cargo_add_option(_j,0,"--beta -b","The beta","i",args + 4);
    if (cargo._4_4_ == 0) {
      cargo._4_4_ = cargo_parse(_j,0,1,5,&local_58);
      if (cargo._4_4_ == 0) {
        pcStack_18 = "Succesfully parsed invalid value";
      }
    }
    else {
      pcStack_18 = "Failed to add options";
    }
    cargo_destroy((cargo_t *)&j);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_parse_invalid_value)
{
    int i;
    int j;
    char *args[] = { "program", "--alpha", "1", "--beta", "a" };

    ret = cargo_add_option(cargo, 0, "--alpha -a", "The alpha", "i", &i);
    ret = cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &j);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret != 0, "Succesfully parsed invalid value");

    _TEST_CLEANUP();
}